

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

size_t g12sVerify_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t n_00;
  size_t sVar2;
  size_t sVar3;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RDI;
  size_t m;
  size_t in_stack_ffffffffffffffc0;
  
  sVar1 = zzMod_deep(in_RDI,in_RDI);
  n_00 = zzMulMod_deep(in_stack_ffffffffffffffc0);
  sVar2 = zzInvMod_deep(n_00);
  sVar3 = ecAddMulA_deep(in_RDI,in_RDX,in_RCX,2,in_RDI,in_RDI);
  sVar1 = utilMax(4,sVar1,n_00,sVar2,sVar3);
  return in_RDI * 0x38 + sVar1;
}

Assistant:

static size_t g12sVerify_deep(size_t n, size_t f_deep, size_t ec_d, 
	size_t ec_deep)
{
	const size_t m = n;
	return O_OF_W(5 * m + 2 * n) +
		utilMax(4,
			zzMod_deep(m, m),
			zzMulMod_deep(m),
			zzInvMod_deep(m),
			ecAddMulA_deep(n, ec_d, ec_deep, 2, m, m));
}